

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_RevSurface::Extend(ON_RevSurface *this,int dir,ON_Interval *domain)

{
  uint uVar1;
  int iVar2;
  double *pdVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  double in_XMM1_Qa;
  ON_BoundingBox local_98;
  undefined1 local_68 [8];
  ON_Interval a;
  double t1;
  double t0;
  undefined1 auStack_40 [7];
  bool rc;
  ON_Interval dom;
  bool do_it;
  ON_Interval *domain_local;
  int dir_local;
  ON_RevSurface *this_local;
  
  if ((dir == 0) || (dir == 1)) {
    uVar1 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x30])
                      (this,(ulong)(uint)dir);
    if ((uVar1 & 1) == 0) {
      dom.m_t[1]._7_1_ = 0;
      (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
      _auStack_40 = extraout_XMM0_Qa;
      dom.m_t[0] = in_XMM1_Qa;
      dVar4 = ON_Interval::operator[](domain,0);
      pdVar3 = ON_Interval::operator[]((ON_Interval *)auStack_40,0);
      if (dVar4 < *pdVar3) {
        dVar4 = ON_Interval::operator[](domain,0);
        pdVar3 = ON_Interval::operator[]((ON_Interval *)auStack_40,0);
        *pdVar3 = dVar4;
        dom.m_t[1]._7_1_ = 1;
      }
      dVar4 = ON_Interval::operator[](domain,1);
      pdVar3 = ON_Interval::operator[]((ON_Interval *)auStack_40,1);
      if (*pdVar3 <= dVar4 && dVar4 != *pdVar3) {
        dVar4 = ON_Interval::operator[](domain,1);
        pdVar3 = ON_Interval::operator[]((ON_Interval *)auStack_40,1);
        *pdVar3 = dVar4;
        dom.m_t[1]._7_1_ = 1;
      }
      if ((dom.m_t[1]._7_1_ & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        domain_local._4_4_ = dir;
        if ((this->m_bTransposed & 1U) != 0) {
          domain_local._4_4_ = 1 - dir;
        }
        t0._7_1_ = false;
        if (domain_local._4_4_ == 0) {
          pdVar3 = ON_Interval::operator[]((ON_Interval *)auStack_40,0);
          dVar4 = ON_Interval::NormalizedParameterAt(&this->m_t,*pdVar3);
          pdVar3 = ON_Interval::operator[]((ON_Interval *)auStack_40,1);
          a.m_t[1] = ON_Interval::NormalizedParameterAt(&this->m_t,*pdVar3);
          ON_Interval::ON_Interval((ON_Interval *)local_68);
          dVar4 = ON_Interval::ParameterAt(&this->m_angle,dVar4);
          pdVar3 = ON_Interval::operator[]((ON_Interval *)local_68,0);
          *pdVar3 = dVar4;
          dVar4 = ON_Interval::ParameterAt(&this->m_angle,a.m_t[1]);
          pdVar3 = ON_Interval::operator[]((ON_Interval *)local_68,1);
          *pdVar3 = dVar4;
          dVar4 = ON_Interval::Length((ON_Interval *)local_68);
          if (6.283185307412417 < dVar4) {
            pdVar3 = ON_Interval::operator[]((ON_Interval *)local_68,0);
            dVar4 = *pdVar3;
            pdVar3 = ON_Interval::operator[]((ON_Interval *)local_68,1);
            *pdVar3 = dVar4 + 6.283185307179586;
          }
          (this->m_angle).m_t[0] = (double)local_68;
          (this->m_angle).m_t[1] = a.m_t[0];
          (this->m_t).m_t[0] = _auStack_40;
          (this->m_t).m_t[1] = dom.m_t[0];
          t0._7_1_ = true;
        }
        else if ((domain_local._4_4_ == 1) && (this->m_curve != (ON_Curve *)0x0)) {
          iVar2 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3d])
                            (this->m_curve,auStack_40);
          t0._7_1_ = (bool)((byte)iVar2 & 1);
        }
        if (t0._7_1_ != false) {
          ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
          ON_BoundingBox::Destroy(&this->m_bbox);
          ON_Geometry::BoundingBox(&local_98,(ON_Geometry *)this);
        }
        this_local._7_1_ = t0._7_1_;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RevSurface::Extend(
      int dir,
      const ON_Interval& domain
      )
{
  if ( dir != 0 && dir != 1 ) 
    return false;
  if (IsClosed(dir)) 
    return false;
  bool do_it = false;
  ON_Interval dom = Domain(dir);
  if (domain[0] < dom[0])
  {
    dom[0] = domain[0];
    do_it = true;
  }
  
  if (domain[1] > dom[1])
  {
    dom[1] = domain[1];
    do_it = true;
  }

  if (!do_it) 
    return false;

  if ( m_bTransposed ) 
    dir = 1-dir;

  bool rc = false;

  if ( dir == 0 )
  {
    double t0 = m_t.NormalizedParameterAt(dom[0]);
    double t1 = m_t.NormalizedParameterAt(dom[1]);
    ON_Interval a;
    a[0] = m_angle.ParameterAt(t0);
    a[1] = m_angle.ParameterAt(t1);
    if (a.Length() > 2.0*ON_PI+ON_ZERO_TOLERANCE) a[1] = a[0]+2.0*ON_PI;
    m_angle = a;
    m_t = dom;
    rc = true;
  }
  else if ( dir == 1 && m_curve )
  {
    rc = m_curve->Extend(dom);
  }

  if ( rc )
  {
    DestroySurfaceTree();
    // update bounding box
    //ON_BoundingBox bbox0 = m_bbox;
    m_bbox.Destroy();
    BoundingBox();
  }
  return rc;
}